

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::EnableLanguage
          (cmGlobalGhsMultiGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  string_view value;
  string_view value_00;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SYSTEM_NAME",&local_41);
  value._M_str = "GHS-MULTI";
  value._M_len = 9;
  cmMakefile::AddDefinition(mf,&local_40,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"GHSMULTI",&local_41);
  value_00._M_str = "1";
  value_00._M_len = 1;
  cmMakefile::AddDefinition(mf,&local_40,value_00);
  std::__cxx11::string::~string((string *)&local_40);
  cmGlobalGenerator::EnableLanguage(&this->super_cmGlobalGenerator,l,mf,optional);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  mf->AddDefinition("CMAKE_SYSTEM_NAME", "GHS-MULTI");

  mf->AddDefinition("GHSMULTI", "1"); // identifier for user CMake files

  this->cmGlobalGenerator::EnableLanguage(l, mf, optional);
}